

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O2

void __thiscall crnlib::sparse_bit_array::set_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint *puVar1;
  uint32 *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (num != 0) {
    uVar4 = (ulong)index;
    if (num == 1) {
      set_bit(this,index);
      return;
    }
    do {
      uVar3 = (uint)uVar4;
      uVar5 = num;
      if (0x200 < num && (uVar4 & 0x1ff) == 0) {
        for (; 0x1ff < uVar5; uVar5 = uVar5 - 0x200) {
          puVar2 = *(uint32 **)((long)this->m_ppGroups + (uVar4 >> 6));
          if (puVar2 == (uint32 *)0x0) {
            puVar2 = alloc_group(true);
            this->m_ppGroups[uVar4 >> 9] = puVar2;
          }
          puVar2[0xc] = 0xffffffff;
          puVar2[0xd] = 0xffffffff;
          puVar2[0xe] = 0xffffffff;
          puVar2[0xf] = 0xffffffff;
          puVar2[8] = 0xffffffff;
          puVar2[9] = 0xffffffff;
          puVar2[10] = 0xffffffff;
          puVar2[0xb] = 0xffffffff;
          puVar2[4] = 0xffffffff;
          puVar2[5] = 0xffffffff;
          puVar2[6] = 0xffffffff;
          puVar2[7] = 0xffffffff;
          *puVar2 = 0xffffffff;
          puVar2[1] = 0xffffffff;
          puVar2[2] = 0xffffffff;
          puVar2[3] = 0xffffffff;
          uVar4 = (ulong)((int)uVar4 + 0x200);
        }
        for (uVar5 = num & 0x1ff; uVar5 != 0; uVar5 = uVar5 - uVar3) {
          puVar2 = this->m_ppGroups[uVar4 >> 9];
          if (puVar2 == (uint32 *)0x0) {
            puVar2 = alloc_group(true);
            this->m_ppGroups[uVar4 >> 9] = puVar2;
          }
          uVar3 = 0x20;
          if (uVar5 < 0x20) {
            uVar3 = uVar5;
          }
          puVar1 = (uint *)((long)puVar2 + (ulong)((uint)(uVar4 >> 3) & 0x3c));
          *puVar1 = *puVar1 | (0xffffffffU >> (-(char)uVar3 & 0x1fU)) << ((byte)uVar4 & 0x1f);
          uVar4 = (ulong)((int)uVar4 + uVar3);
        }
        return;
      }
      puVar2 = this->m_ppGroups[uVar4 >> 9];
      if (puVar2 == (uint32 *)0x0) {
        puVar2 = alloc_group(true);
        this->m_ppGroups[uVar4 >> 9] = puVar2;
      }
      uVar5 = 0x20 - (uVar3 & 0x1f);
      if (num <= uVar5) {
        uVar5 = num;
      }
      puVar2[(uVar3 & 0x1ff) >> 5] =
           puVar2[(uVar3 & 0x1ff) >> 5] |
           (0xffffffffU >> (-(char)uVar5 & 0x1fU)) << (sbyte)(uVar3 & 0x1f);
      uVar4 = (ulong)(uVar3 + uVar5);
      num = num - uVar5;
    } while (num != 0);
  }
  return;
}

Assistant:

void sparse_bit_array::set_bit_range(uint index, uint num) {
  CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

  if (!num)
    return;
  else if (num == 1) {
    set_bit(index);
    return;
  }

  while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup)) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    const uint group_bit_ofs = index & cBitsPerGroupMask;

    const uint dword_bit_ofs = group_bit_ofs & 31;
    const uint max_bits_to_set = 32 - dword_bit_ofs;

    const uint bits_to_set = math::minimum(max_bits_to_set, num);
    const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

    pGroup[group_bit_ofs >> 5] |= (msk << dword_bit_ofs);

    num -= bits_to_set;
    if (!num)
      return;

    index += bits_to_set;
  }

  while (num >= cBitsPerGroup) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    memset(pGroup, 0xFF, sizeof(uint32) * cDWORDsPerGroup);

    num -= cBitsPerGroup;
    index += cBitsPerGroup;
  }

  while (num) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    uint group_bit_ofs = index & cBitsPerGroupMask;

    uint bits_to_set = math::minimum(32U, num);
    uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

    pGroup[group_bit_ofs >> 5] |= (msk << (group_bit_ofs & 31));

    num -= bits_to_set;
    index += bits_to_set;
  }
}